

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::Parser::GenerateMapEntry
          (Parser *this,MapField *map_field,FieldDescriptorProto *field,
          RepeatedPtrField<google::protobuf::DescriptorProto> *messages)

{
  uint *puVar1;
  RepeatedPtrFieldBase *this_00;
  uint uVar2;
  Type TVar3;
  Rep *pRVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  int *piVar8;
  MapField *pMVar9;
  FieldDescriptorProto *pFVar10;
  bool bVar11;
  bool bVar12;
  int iVar13;
  DescriptorProto *obj;
  MessageOptions *pMVar14;
  void *pvVar15;
  FieldDescriptorProto *pFVar16;
  void *pvVar17;
  Type *from;
  LogMessage *pLVar18;
  FieldOptions *pFVar19;
  UninterpretedOption *pUVar20;
  undefined8 *puVar21;
  long *plVar22;
  int iVar23;
  Arena *pAVar24;
  undefined1 *puVar25;
  long lVar26;
  string entry_name;
  LogFinisher local_d1;
  MapField *local_d0;
  undefined1 *local_c8;
  undefined8 local_c0;
  undefined1 local_b8 [16];
  FieldDescriptorProto *local_a8;
  LogMessage local_a0;
  LogMessage local_68;
  
  pRVar4 = (messages->super_RepeatedPtrFieldBase).rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_0034495f:
    obj = Arena::CreateMaybeMessage<google::protobuf::DescriptorProto>
                    ((messages->super_RepeatedPtrFieldBase).arena_);
    pvVar17 = internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&messages->super_RepeatedPtrFieldBase,obj);
  }
  else {
    iVar23 = (messages->super_RepeatedPtrFieldBase).current_size_;
    if (pRVar4->allocated_size <= iVar23) goto LAB_0034495f;
    (messages->super_RepeatedPtrFieldBase).current_size_ = iVar23 + 1;
    pvVar17 = pRVar4->elements[iVar23];
  }
  plVar22 = (long *)((ulong)(field->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
  local_c8 = local_b8;
  local_c0 = 0;
  local_b8[0] = 0;
  local_d0 = map_field;
  local_a8 = field;
  std::__cxx11::string::reserve((ulong)&local_c8);
  lVar5 = plVar22[1];
  if (lVar5 != 0) {
    lVar6 = *plVar22;
    bVar12 = true;
    lVar26 = 0;
    do {
      bVar11 = true;
      if (*(char *)(lVar6 + lVar26) != '_') {
        if (bVar12) {
          std::__cxx11::string::push_back((char)&local_c8);
          bVar11 = false;
        }
        else {
          std::__cxx11::string::push_back((char)&local_c8);
          bVar11 = bVar12;
        }
      }
      bVar12 = bVar11;
      lVar26 = lVar26 + 1;
    } while (lVar5 != lVar26);
  }
  std::__cxx11::string::append((char *)&local_c8);
  pFVar10 = local_a8;
  pMVar9 = local_d0;
  *(byte *)(local_a8->_has_bits_).has_bits_ = (byte)(local_a8->_has_bits_).has_bits_[0] | 4;
  uVar7 = (local_a8->super_Message).super_MessageLite._internal_metadata_.ptr_;
  puVar21 = (undefined8 *)(uVar7 & 0xfffffffffffffffc);
  if ((uVar7 & 1) != 0) {
    puVar21 = (undefined8 *)*puVar21;
  }
  internal::ArenaStringPtr::Set(&local_a8->type_name_,&local_c8,puVar21);
  *(byte *)((long)pvVar17 + 0x10) = *(byte *)((long)pvVar17 + 0x10) | 1;
  puVar21 = (undefined8 *)(*(ulong *)((long)pvVar17 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar17 + 8) & 1) != 0) {
    puVar21 = (undefined8 *)*puVar21;
  }
  internal::ArenaStringPtr::Set((ArenaStringPtr *)((long)pvVar17 + 0xd8),&local_c8,puVar21);
  *(byte *)((long)pvVar17 + 0x10) = *(byte *)((long)pvVar17 + 0x10) | 2;
  if (*(long *)((long)pvVar17 + 0xe0) == 0) {
    pAVar24 = (Arena *)(*(ulong *)((long)pvVar17 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar17 + 8) & 1) != 0) {
      pAVar24 = *(Arena **)pAVar24;
    }
    pMVar14 = Arena::CreateMaybeMessage<google::protobuf::MessageOptions>(pAVar24);
    *(MessageOptions **)((long)pvVar17 + 0xe0) = pMVar14;
  }
  lVar5 = *(long *)((long)pvVar17 + 0xe0);
  puVar1 = (uint *)(lVar5 + 0x28);
  *puVar1 = *puVar1 | 8;
  *(undefined1 *)(lVar5 + 0x4b) = 1;
  this_00 = (RepeatedPtrFieldBase *)((long)pvVar17 + 0x18);
  piVar8 = *(int **)((long)pvVar17 + 0x28);
  if (piVar8 == (int *)0x0) {
LAB_00344ae0:
    pFVar16 = Arena::CreateMaybeMessage<google::protobuf::FieldDescriptorProto>(this_00->arena_);
    pvVar15 = internal::RepeatedPtrFieldBase::AddOutOfLineHelper(this_00,pFVar16);
  }
  else {
    iVar23 = *(int *)((long)pvVar17 + 0x20);
    if (*piVar8 <= iVar23) goto LAB_00344ae0;
    *(int *)((long)pvVar17 + 0x20) = iVar23 + 1;
    pvVar15 = *(void **)(piVar8 + (long)iVar23 * 2 + 2);
  }
  *(byte *)((long)pvVar15 + 0x10) = *(byte *)((long)pvVar15 + 0x10) | 1;
  puVar21 = (undefined8 *)(*(ulong *)((long)pvVar15 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar15 + 8) & 1) != 0) {
    puVar21 = (undefined8 *)*puVar21;
  }
  internal::ArenaStringPtr::Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar15 + 0x18),"key",puVar21);
  bVar12 = FieldDescriptorProto_Label_IsValid(1);
  if (!bVar12) goto LAB_00344f08;
  uVar2 = *(uint *)((long)pvVar15 + 0x10);
  *(undefined4 *)((long)pvVar15 + 0x54) = 1;
  *(uint *)((long)pvVar15 + 0x10) = uVar2 | 0x240;
  *(undefined4 *)((long)pvVar15 + 0x48) = 1;
  if ((pMVar9->key_type_name)._M_string_length == 0) {
    TVar3 = pMVar9->key_type;
    bVar12 = FieldDescriptorProto_Type_IsValid(TVar3);
    if (!bVar12) goto LAB_00344f27;
    *(byte *)((long)pvVar15 + 0x11) = *(byte *)((long)pvVar15 + 0x11) | 4;
    *(Type *)((long)pvVar15 + 0x58) = TVar3;
  }
  else {
    *(uint *)((long)pvVar15 + 0x10) = uVar2 | 0x244;
    puVar21 = (undefined8 *)(*(ulong *)((long)pvVar15 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar15 + 8) & 1) != 0) {
      puVar21 = (undefined8 *)*puVar21;
    }
    internal::ArenaStringPtr::Set
              ((ArenaStringPtr *)((long)pvVar15 + 0x28),&pMVar9->key_type_name,puVar21);
  }
  piVar8 = *(int **)((long)pvVar17 + 0x28);
  if (piVar8 == (int *)0x0) {
LAB_00344bbe:
    pFVar16 = Arena::CreateMaybeMessage<google::protobuf::FieldDescriptorProto>(this_00->arena_);
    pvVar17 = internal::RepeatedPtrFieldBase::AddOutOfLineHelper(this_00,pFVar16);
  }
  else {
    iVar23 = *(int *)((long)pvVar17 + 0x20);
    if (*piVar8 <= iVar23) goto LAB_00344bbe;
    *(int *)((long)pvVar17 + 0x20) = iVar23 + 1;
    pvVar17 = *(void **)(piVar8 + (long)iVar23 * 2 + 2);
  }
  *(byte *)((long)pvVar17 + 0x10) = *(byte *)((long)pvVar17 + 0x10) | 1;
  puVar21 = (undefined8 *)(*(ulong *)((long)pvVar17 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar17 + 8) & 1) != 0) {
    puVar21 = (undefined8 *)*puVar21;
  }
  internal::ArenaStringPtr::Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar17 + 0x18),"value",puVar21);
  bVar12 = FieldDescriptorProto_Label_IsValid(1);
  if (bVar12) {
    uVar2 = *(uint *)((long)pvVar17 + 0x10);
    *(undefined4 *)((long)pvVar17 + 0x54) = 1;
    *(uint *)((long)pvVar17 + 0x10) = uVar2 | 0x240;
    *(undefined4 *)((long)pvVar17 + 0x48) = 2;
    if ((pMVar9->value_type_name)._M_string_length == 0) {
      TVar3 = pMVar9->value_type;
      bVar12 = FieldDescriptorProto_Type_IsValid(TVar3);
      if (!bVar12) {
LAB_00344f27:
        __assert_fail("::PROTOBUF_NAMESPACE_ID::FieldDescriptorProto_Type_IsValid(value)",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.h"
                      ,0x27b0,
                      "void google::protobuf::FieldDescriptorProto::_internal_set_type(::google::protobuf::FieldDescriptorProto_Type)"
                     );
      }
      *(byte *)((long)pvVar17 + 0x11) = *(byte *)((long)pvVar17 + 0x11) | 4;
      *(Type *)((long)pvVar17 + 0x58) = TVar3;
    }
    else {
      *(uint *)((long)pvVar17 + 0x10) = uVar2 | 0x244;
      puVar21 = (undefined8 *)(*(ulong *)((long)pvVar17 + 8) & 0xfffffffffffffffc);
      if ((*(ulong *)((long)pvVar17 + 8) & 1) != 0) {
        puVar21 = (undefined8 *)*puVar21;
      }
      internal::ArenaStringPtr::Set
                ((ArenaStringPtr *)((long)pvVar17 + 0x28),&pMVar9->value_type_name,puVar21);
    }
    puVar25 = (undefined1 *)pFVar10->options_;
    if ((FieldOptions *)puVar25 == (FieldOptions *)0x0) {
      puVar25 = _FieldOptions_default_instance_;
    }
    if (0 < (((FieldOptions *)puVar25)->uninterpreted_option_).super_RepeatedPtrFieldBase.
            current_size_) {
      iVar23 = 0;
      do {
        from = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>::TypeHandler>
                         (&(((FieldOptions *)puVar25)->uninterpreted_option_).
                           super_RepeatedPtrFieldBase,iVar23);
        if ((from->name_).super_RepeatedPtrFieldBase.current_size_ == 1) {
          if ((from->name_).super_RepeatedPtrFieldBase.current_size_ < 1) {
            internal::LogMessage::LogMessage
                      (&local_a0,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
                       ,0x358);
            pLVar18 = internal::LogMessage::operator<<
                                (&local_a0,"CHECK failed: (index) < (current_size_): ");
            internal::LogFinisher::operator=(&local_d1,pLVar18);
            internal::LogMessage::~LogMessage(&local_a0);
          }
          iVar13 = std::__cxx11::string::compare
                             ((char *)(*(ulong *)((long)((from->name_).super_RepeatedPtrFieldBase.
                                                        rep_)->elements[0] + 0x18) &
                                      0xfffffffffffffffe));
          if (iVar13 == 0) {
            if ((from->name_).super_RepeatedPtrFieldBase.current_size_ < 1) {
              internal::LogMessage::LogMessage
                        (&local_68,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
                         ,0x358);
              pLVar18 = internal::LogMessage::operator<<
                                  (&local_68,"CHECK failed: (index) < (current_size_): ");
              internal::LogFinisher::operator=(&local_d1,pLVar18);
              internal::LogMessage::~LogMessage(&local_68);
            }
            if (*(char *)((long)((from->name_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x20)
                == '\0') {
              if (*(int *)((long)pvVar15 + 0x58) == 9) {
                *(byte *)((long)pvVar15 + 0x10) = *(byte *)((long)pvVar15 + 0x10) | 0x20;
                if (*(long *)((long)pvVar15 + 0x40) == 0) {
                  pAVar24 = (Arena *)(*(ulong *)((long)pvVar15 + 8) & 0xfffffffffffffffc);
                  if ((*(ulong *)((long)pvVar15 + 8) & 1) != 0) {
                    pAVar24 = *(Arena **)pAVar24;
                  }
                  pFVar19 = Arena::CreateMaybeMessage<google::protobuf::FieldOptions>(pAVar24);
                  *(FieldOptions **)((long)pvVar15 + 0x40) = pFVar19;
                }
                lVar5 = *(long *)((long)pvVar15 + 0x40);
                piVar8 = *(int **)(lVar5 + 0x40);
                if (piVar8 == (int *)0x0) {
LAB_00344de6:
                  pUVar20 = Arena::CreateMaybeMessage<google::protobuf::UninterpretedOption>
                                      (((RepeatedPtrFieldBase *)(lVar5 + 0x30))->arena_);
                  pUVar20 = (UninterpretedOption *)
                            internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                                      ((RepeatedPtrFieldBase *)(lVar5 + 0x30),pUVar20);
                }
                else {
                  iVar13 = *(int *)(lVar5 + 0x38);
                  if (*piVar8 <= iVar13) goto LAB_00344de6;
                  *(int *)(lVar5 + 0x38) = iVar13 + 1;
                  pUVar20 = *(UninterpretedOption **)(piVar8 + (long)iVar13 * 2 + 2);
                }
                UninterpretedOption::CopyFrom(pUVar20,from);
              }
              if (*(int *)((long)pvVar17 + 0x58) == 9) {
                *(byte *)((long)pvVar17 + 0x10) = *(byte *)((long)pvVar17 + 0x10) | 0x20;
                if (*(long *)((long)pvVar17 + 0x40) == 0) {
                  pAVar24 = (Arena *)(*(ulong *)((long)pvVar17 + 8) & 0xfffffffffffffffc);
                  if ((*(ulong *)((long)pvVar17 + 8) & 1) != 0) {
                    pAVar24 = *(Arena **)pAVar24;
                  }
                  pFVar19 = Arena::CreateMaybeMessage<google::protobuf::FieldOptions>(pAVar24);
                  *(FieldOptions **)((long)pvVar17 + 0x40) = pFVar19;
                }
                lVar5 = *(long *)((long)pvVar17 + 0x40);
                piVar8 = *(int **)(lVar5 + 0x40);
                if (piVar8 == (int *)0x0) {
LAB_00344e5d:
                  pUVar20 = Arena::CreateMaybeMessage<google::protobuf::UninterpretedOption>
                                      (((RepeatedPtrFieldBase *)(lVar5 + 0x30))->arena_);
                  pUVar20 = (UninterpretedOption *)
                            internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                                      ((RepeatedPtrFieldBase *)(lVar5 + 0x30),pUVar20);
                }
                else {
                  iVar13 = *(int *)(lVar5 + 0x38);
                  if (*piVar8 <= iVar13) goto LAB_00344e5d;
                  *(int *)(lVar5 + 0x38) = iVar13 + 1;
                  pUVar20 = *(UninterpretedOption **)(piVar8 + (long)iVar13 * 2 + 2);
                }
                UninterpretedOption::CopyFrom(pUVar20,from);
              }
            }
          }
        }
        puVar25 = (undefined1 *)pFVar10->options_;
        if ((FieldOptions *)puVar25 == (FieldOptions *)0x0) {
          puVar25 = _FieldOptions_default_instance_;
        }
        iVar23 = iVar23 + 1;
      } while (iVar23 < (((FieldOptions *)puVar25)->uninterpreted_option_).
                        super_RepeatedPtrFieldBase.current_size_);
    }
    if (local_c8 != local_b8) {
      operator_delete(local_c8);
    }
    return;
  }
LAB_00344f08:
  __assert_fail("::PROTOBUF_NAMESPACE_ID::FieldDescriptorProto_Label_IsValid(value)",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.h"
                ,0x2793,
                "void google::protobuf::FieldDescriptorProto::_internal_set_label(::google::protobuf::FieldDescriptorProto_Label)"
               );
}

Assistant:

void Parser::GenerateMapEntry(const MapField& map_field,
                              FieldDescriptorProto* field,
                              RepeatedPtrField<DescriptorProto>* messages) {
  DescriptorProto* entry = messages->Add();
  std::string entry_name = MapEntryName(field->name());
  field->set_type_name(entry_name);
  entry->set_name(entry_name);
  entry->mutable_options()->set_map_entry(true);
  FieldDescriptorProto* key_field = entry->add_field();
  key_field->set_name("key");
  key_field->set_label(FieldDescriptorProto::LABEL_OPTIONAL);
  key_field->set_number(1);
  if (map_field.key_type_name.empty()) {
    key_field->set_type(map_field.key_type);
  } else {
    key_field->set_type_name(map_field.key_type_name);
  }
  FieldDescriptorProto* value_field = entry->add_field();
  value_field->set_name("value");
  value_field->set_label(FieldDescriptorProto::LABEL_OPTIONAL);
  value_field->set_number(2);
  if (map_field.value_type_name.empty()) {
    value_field->set_type(map_field.value_type);
  } else {
    value_field->set_type_name(map_field.value_type_name);
  }
  // Propagate the "enforce_utf8" option to key and value fields if they
  // are strings. This helps simplify the implementation of code generators
  // and also reflection-based parsing code.
  //
  // The following definition:
  //   message Foo {
  //     map<string, string> value = 1 [enforce_utf8 = false];
  //   }
  // will be interpreted as:
  //   message Foo {
  //     message ValueEntry {
  //       option map_entry = true;
  //       string key = 1 [enforce_utf8 = false];
  //       string value = 2 [enforce_utf8 = false];
  //     }
  //     repeated ValueEntry value = 1 [enforce_utf8 = false];
  //  }
  //
  // TODO(xiaofeng): Remove this when the "enforce_utf8" option is removed
  // from protocol compiler.
  for (int i = 0; i < field->options().uninterpreted_option_size(); ++i) {
    const UninterpretedOption& option =
        field->options().uninterpreted_option(i);
    if (option.name_size() == 1 &&
        option.name(0).name_part() == "enforce_utf8" &&
        !option.name(0).is_extension()) {
      if (key_field->type() == FieldDescriptorProto::TYPE_STRING) {
        key_field->mutable_options()->add_uninterpreted_option()->CopyFrom(
            option);
      }
      if (value_field->type() == FieldDescriptorProto::TYPE_STRING) {
        value_field->mutable_options()->add_uninterpreted_option()->CopyFrom(
            option);
      }
    }
  }
}